

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MinimumValueCase::MinimumValueCase
          (MinimumValueCase *this,Context *context,char *name,char *desc,GLenum target,int minValue,
          QueryType verifierType)

{
  ApiType AVar1;
  int minValue_local;
  GLenum target_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  MinimumValueCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MinimumValueCase_032b6b78;
  this->m_target = target;
  this->m_minValue = minValue;
  this->m_verifierType = verifierType;
  AVar1 = glu::ApiType::es(3,1);
  (this->m_minimumVersion).m_bits = AVar1.m_bits;
  return;
}

Assistant:

MinimumValueCase::MinimumValueCase (Context& context, const char* name, const char* desc, glw::GLenum target, int minValue, QueryType verifierType)
	: TestCase			(context, name, desc)
	, m_target			(target)
	, m_minValue		(minValue)
	, m_verifierType	(verifierType)
	, m_minimumVersion	(glu::ApiType::es(3, 1))
{
}